

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall Object_GetNotFound_Test::TestBody(Object_GetNotFound_Test *this)

{
  allocator<pstore::dump::object::member> *this_00;
  initializer_list<pstore::dump::object::member> __l;
  bool bVar1;
  char *message;
  member *local_160;
  AssertHelper local_148;
  Message local_140;
  allocator local_131;
  string local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  allocator local_c9;
  string local_c8;
  member *local_a8;
  member local_a0;
  iterator local_70;
  size_type local_68;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_60;
  undefined1 local_48 [8];
  object object;
  value_ptr v;
  Object_GetNotFound_Test *this_local;
  
  pstore::dump::make_value((dump *)&object.compact_,"Hello World");
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = 1;
  local_a8 = &local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"key",&local_c9);
  pstore::dump::object::member::member(&local_a0,&local_c8,(value_ptr *)&object.compact_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = 0;
  local_70 = &local_a0;
  local_68 = 1;
  this_00 = (allocator<pstore::dump::object::member> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 2);
  std::allocator<pstore::dump::object::member>::allocator(this_00);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_60,__l,this_00);
  pstore::dump::object::object((object *)local_48,&local_60);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_60);
  std::allocator<pstore::dump::object::member>::~allocator
            ((allocator<pstore::dump::object::member> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 2));
  local_160 = (member *)&local_70;
  do {
    local_160 = local_160 + -1;
    pstore::dump::object::member::~member(local_160);
  } while (local_160 != &local_a0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::shared_ptr<pstore::dump::value>::shared_ptr
            ((shared_ptr<pstore::dump::value> *)(local_110 + 0x10),(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"missing",&local_131);
  pstore::dump::object::get((object *)local_110,(string *)local_48);
  testing::internal::EqHelper::
  Compare<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_nullptr>
            ((EqHelper *)local_f0,"std::shared_ptr<value> (nullptr)","object.get (\"missing\")",
             (shared_ptr<pstore::dump::value> *)(local_110 + 0x10),
             (shared_ptr<pstore::dump::value> *)local_110);
  std::shared_ptr<pstore::dump::value>::~shared_ptr((shared_ptr<pstore::dump::value> *)local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::shared_ptr<pstore::dump::value>::~shared_ptr
            ((shared_ptr<pstore::dump::value> *)(local_110 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  pstore::dump::object::~object((object *)local_48);
  std::shared_ptr<pstore::dump::value>::~shared_ptr
            ((shared_ptr<pstore::dump::value> *)&object.compact_);
  return;
}

Assistant:

TEST (Object, GetNotFound) {
    using namespace ::pstore::dump;
    auto v = make_value ("Hello World");
    object object{{{"key", v}}};
    EXPECT_EQ (std::shared_ptr<value> (nullptr), object.get ("missing"));
}